

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_srtp_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> SVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  Type *pTVar4;
  bool bVar5;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> SVar6;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __begin1;
  CBB contents;
  CBB profile_ids;
  
  ssl = (SSL *)hs->ssl;
  sk = (OPENSSL_STACK *)SSL_get_srtp_profiles(ssl);
  bVar5 = true;
  if (((sk != (OPENSSL_STACK *)0x0) && (sVar3 = OPENSSL_sk_num(sk), sVar3 != 0)) &&
     (iVar2 = SSL_is_dtls((SSL *)ssl), iVar2 != 0)) {
    iVar2 = CBB_add_u16(out_compressible,0xe);
    if (((iVar2 != 0) &&
        (iVar2 = CBB_add_u16_length_prefixed(out_compressible,&contents), iVar2 != 0)) &&
       (iVar2 = CBB_add_u16_length_prefixed(&contents,&profile_ids), iVar2 != 0)) {
      __begin1.idx_ = 0;
      __begin1.sk_ = (stack_st_SRTP_PROTECTION_PROFILE *)sk;
      SVar6 = end<stack_st_SRTP_PROTECTION_PROFILE>((stack_st_SRTP_PROTECTION_PROFILE *)sk);
      sVar3 = 0;
      while( true ) {
        SVar1.idx_ = sVar3;
        SVar1.sk_ = (stack_st_SRTP_PROTECTION_PROFILE *)sk;
        if (SVar6 == SVar1) {
          iVar2 = CBB_add_u8(&contents,'\0');
          if (iVar2 == 0) {
            return false;
          }
          iVar2 = CBB_flush(out_compressible);
          return iVar2 != 0;
        }
        pTVar4 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator*(&__begin1)
        ;
        iVar2 = CBB_add_u16(&profile_ids,(uint16_t)pTVar4->id);
        if (iVar2 == 0) break;
        sVar3 = __begin1.idx_ + 1;
        sk = (OPENSSL_STACK *)__begin1.sk_;
        __begin1.idx_ = sVar3;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool ext_srtp_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  const STACK_OF(SRTP_PROTECTION_PROFILE) *profiles =
      SSL_get_srtp_profiles(ssl);
  if (profiles == NULL ||                               //
      sk_SRTP_PROTECTION_PROFILE_num(profiles) == 0 ||  //
      !SSL_is_dtls(ssl)) {
    return true;
  }

  CBB contents, profile_ids;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_srtp) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &profile_ids)) {
    return false;
  }

  for (const SRTP_PROTECTION_PROFILE *profile : profiles) {
    if (!CBB_add_u16(&profile_ids, profile->id)) {
      return false;
    }
  }

  if (!CBB_add_u8(&contents, 0 /* empty use_mki value */) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}